

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall
cmCTest::GetTestModelString_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if ((this->SpecificTrack)._M_string_length == 0) {
    if (this->TestModel == 2) {
      pcVar2 = "Continuous";
      paVar1 = &local_a;
    }
    else if (this->TestModel == 1) {
      pcVar2 = "Nightly";
      paVar1 = &local_9;
    }
    else {
      pcVar2 = "Experimental";
      paVar1 = &local_b;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->SpecificTrack);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetTestModelString()
{
  if ( !this->SpecificTrack.empty() )
    {
    return this->SpecificTrack;
    }
  switch ( this->TestModel )
    {
  case cmCTest::NIGHTLY:
    return "Nightly";
  case cmCTest::CONTINUOUS:
    return "Continuous";
    }
  return "Experimental";
}